

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int allBytesIdentical(void *src,size_t srcSize)

{
  ulong in_RSI;
  char *in_RDI;
  size_t p;
  BYTE b;
  ulong local_28;
  
  if (in_RSI == 0) {
    __assert_fail("srcSize >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4a3d,"int allBytesIdentical(const void *, size_t)");
  }
  if (in_RDI != (char *)0x0) {
    local_28 = 1;
    while( true ) {
      if (in_RSI <= local_28) {
        return 1;
      }
      if (in_RDI[local_28] != *in_RDI) break;
      local_28 = local_28 + 1;
    }
    return 0;
  }
  __assert_fail("src != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x4a3e,"int allBytesIdentical(const void *, size_t)");
}

Assistant:

static int allBytesIdentical(const void* src, size_t srcSize)
{
    assert(srcSize >= 1);
    assert(src != NULL);
    {   const BYTE b = ((const BYTE*)src)[0];
        size_t p;
        for (p=1; p<srcSize; p++) {
            if (((const BYTE*)src)[p] != b) return 0;
        }
        return 1;
    }
}